

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O0

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::EigenDecompositionSquare
          (EigenDecompositionSquare<float,_1> *this,int decompositionCount,int stateCount,
          int categoryCount,long flags)

{
  float **ppfVar1;
  undefined8 uVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  float *pfVar5;
  bad_alloc *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  EigenDecomposition<float,_1> *in_RDI;
  long in_R8;
  int i;
  bad_alloc *in_stack_ffffffffffffffa0;
  int local_30;
  
  EigenDecomposition<float,_1>::EigenDecomposition(in_RDI,in_ESI,in_EDX,in_ECX,in_R8);
  in_RDI->_vptr_EigenDecomposition = (_func_int **)&PTR__EigenDecompositionSquare_001ca6d8;
  *(bool *)&in_RDI[1].kStateCount = (in_RDI->kFlags & 0x20U) != 0;
  if ((in_RDI[1].kStateCount & 1) == 0) {
    in_RDI[1].kEigenDecompCount = in_RDI->kStateCount;
  }
  else {
    in_RDI[1].kEigenDecompCount = in_RDI->kStateCount << 1;
  }
  ppfVar1 = (float **)malloc((long)in_RDI->kEigenDecompCount << 3);
  in_RDI->gEigenValues = ppfVar1;
  if (in_RDI->gEigenValues == (float **)0x0) {
    uVar2 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffffa0);
    __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  pp_Var3 = (_func_int **)malloc((long)in_RDI->kEigenDecompCount << 3);
  in_RDI[1]._vptr_EigenDecomposition = pp_Var3;
  if (in_RDI[1]._vptr_EigenDecomposition == (_func_int **)0x0) {
    uVar2 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffffa0);
    __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  ppfVar1 = (float **)malloc((long)in_RDI->kEigenDecompCount << 3);
  in_RDI[1].gEigenValues = ppfVar1;
  if (in_RDI[1].gEigenValues == (float **)0x0) {
    uVar2 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffffa0);
    __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_30 = 0;
  while( true ) {
    if (in_RDI->kEigenDecompCount <= local_30) {
      pfVar5 = (float *)malloc((long)in_RDI->kStateCount * 4 * (long)in_RDI->kStateCount);
      in_RDI->matrixTmp = pfVar5;
      return;
    }
    p_Var4 = (_func_int *)malloc((long)in_RDI->kStateCount * 4 * (long)in_RDI->kStateCount);
    in_RDI[1]._vptr_EigenDecomposition[local_30] = p_Var4;
    if (in_RDI[1]._vptr_EigenDecomposition[local_30] == (_func_int *)0x0) {
      uVar2 = __cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(in_stack_ffffffffffffffa0);
      __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    pfVar5 = (float *)malloc((long)in_RDI->kStateCount * 4 * (long)in_RDI->kStateCount);
    in_RDI[1].gEigenValues[local_30] = pfVar5;
    if (in_RDI[1].gEigenValues[local_30] == (float *)0x0) {
      this_00 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(this_00);
      __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    pfVar5 = (float *)malloc((long)in_RDI[1].kEigenDecompCount << 2);
    in_RDI->gEigenValues[local_30] = pfVar5;
    if (in_RDI->gEigenValues[local_30] == (float *)0x0) break;
    local_30 = local_30 + 1;
  }
  uVar2 = __cxa_allocate_exception(8);
  std::bad_alloc::bad_alloc(in_stack_ffffffffffffffa0);
  __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::EigenDecompositionSquare(int decompositionCount,
											       int stateCount,
											       int categoryCount,
											       long flags)
	: EigenDecomposition<BEAGLE_CPU_EIGEN_GENERIC>(decompositionCount,stateCount,categoryCount, flags) {

	isComplex = kFlags & BEAGLE_FLAG_EIGEN_COMPLEX;

	if (isComplex)
		kEigenValuesSize = 2 * kStateCount;
	else
		kEigenValuesSize = kStateCount;

    this->gEigenValues = (REALTYPE**) malloc(sizeof(REALTYPE*) * kEigenDecompCount);
    if (gEigenValues == NULL)
        throw std::bad_alloc();

    gEMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kEigenDecompCount);
    if (gEMatrices == NULL)
    	throw std::bad_alloc();

    gIMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kEigenDecompCount);
       if (gIMatrices == NULL)
       	throw std::bad_alloc();

    for (int i = 0; i < kEigenDecompCount; i++) {
    	gEMatrices[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount * kStateCount);
    	if (gEMatrices[i] == NULL)
    		throw std::bad_alloc();

    	gIMatrices[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount * kStateCount);
    	if (gIMatrices[i] == NULL)
    		throw std::bad_alloc();

    	gEigenValues[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * kEigenValuesSize);
    	if (gEigenValues[i] == NULL)
    		throw std::bad_alloc();
    }

    matrixTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kStateCount * kStateCount);
}